

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distinct_relation.cpp
# Opt level: O2

void __thiscall
duckdb::DistinctRelation::DistinctRelation
          (DistinctRelation *this,shared_ptr<duckdb::Relation,_true> *child_p)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Relation *pRVar3;
  allocator local_49;
  vector<duckdb::ColumnDefinition,_true> dummy_columns;
  
  pRVar3 = shared_ptr<duckdb::Relation,_true>::operator->(child_p);
  ::std::__cxx11::string::string((string *)&dummy_columns,anon_var_dwarf_4b4b1b2 + 9,&local_49);
  Relation::Relation(&this->super_Relation,&pRVar3->context,DISTINCT_RELATION,
                     (string *)&dummy_columns);
  ::std::__cxx11::string::~string((string *)&dummy_columns);
  (this->super_Relation)._vptr_Relation = (_func_int **)&PTR__DistinctRelation_027c8ac0;
  (this->child).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var2 = (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->child).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (this->child).internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  (child_p->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  dummy_columns.super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dummy_columns.super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dummy_columns.super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
  super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Relation::TryBindRelation(&this->super_Relation,&dummy_columns);
  ::std::vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>::~vector
            (&dummy_columns.
              super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>);
  return;
}

Assistant:

DistinctRelation::DistinctRelation(shared_ptr<Relation> child_p)
    : Relation(child_p->context, RelationType::DISTINCT_RELATION), child(std::move(child_p)) {
	D_ASSERT(child.get() != this);
	vector<ColumnDefinition> dummy_columns;
	TryBindRelation(dummy_columns);
}